

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

Ops * __thiscall miniscript::Node<CPubKey>::CalcOps(Ops *__return_storage_ptr__,Node<CPubKey> *this)

{
  char cVar1;
  uint32_t uVar2;
  pointer psVar3;
  element_type *peVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  pointer pMVar8;
  pointer pMVar9;
  ulong uVar10;
  element_type *peVar11;
  MaxInt<unsigned_int> MVar12;
  uint uVar13;
  uint uVar14;
  MaxInt<unsigned_int> MVar15;
  ulong uVar16;
  uint uVar17;
  MaxInt<unsigned_int> MVar18;
  element_type *peVar19;
  pointer psVar20;
  int iVar21;
  MaxInt<unsigned_int> MVar22;
  MaxInt<unsigned_int> MVar23;
  MaxInt<unsigned_int> MVar24;
  MaxInt<unsigned_int> MVar25;
  MaxInt<unsigned_int> MVar26;
  uint32_t uVar27;
  long in_FS_OFFSET;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  next_sats;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  ret;
  MaxInt<unsigned_int> local_80;
  MaxInt<unsigned_int> local_78;
  pointer pMStack_70;
  pointer local_68;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(this->fragment) {
  case JUST_0:
    __return_storage_ptr__->count = 0;
    (__return_storage_ptr__->sat).valid = false;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).value = 0;
    goto LAB_00493794;
  case JUST_1:
    __return_storage_ptr__->count = 0;
    goto LAB_004936f0;
  case PK_K:
    __return_storage_ptr__->count = 0;
    goto LAB_00493839;
  case PK_H:
    __return_storage_ptr__->count = 3;
    goto LAB_00493839;
  case OLDER:
  case AFTER:
    __return_storage_ptr__->count = 1;
    goto LAB_004936f0;
  case SHA256:
  case HASH256:
  case RIPEMD160:
  case HASH160:
    __return_storage_ptr__->count = 4;
LAB_004936f0:
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).value = 0;
    break;
  case WRAP_A:
    peVar11 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar27 = (peVar11->ops).count + 2;
    goto LAB_0049352e;
  case WRAP_S:
  case WRAP_C:
  case WRAP_N:
    peVar11 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar27 = (peVar11->ops).count + 1;
LAB_0049352e:
    MVar15 = *(MaxInt<unsigned_int> *)((long)&peVar11->ops + 4);
    MVar26 = *(MaxInt<unsigned_int> *)((long)&peVar11->ops + 0xc);
    __return_storage_ptr__->count = uVar27;
    __return_storage_ptr__->sat = MVar15;
    __return_storage_ptr__->dsat = MVar26;
    goto LAB_004939d7;
  case WRAP_D:
    peVar11 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar27 = (peVar11->ops).count + 3;
    goto LAB_0049378a;
  case WRAP_V:
    peVar11 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    MVar15 = *(MaxInt<unsigned_int> *)((long)&peVar11->ops + 4);
    __return_storage_ptr__->count =
         (peVar11->ops).count + (uint)(((peVar11->typ).m_flags >> 0xd & 1) != 0);
    __return_storage_ptr__->sat = MVar15;
    break;
  case WRAP_J:
    peVar11 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar27 = (peVar11->ops).count + 4;
LAB_0049378a:
    MVar15 = *(MaxInt<unsigned_int> *)((long)&peVar11->ops + 4);
    __return_storage_ptr__->count = uVar27;
    __return_storage_ptr__->sat = MVar15;
LAB_00493794:
    (__return_storage_ptr__->dsat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).value = 0;
    goto LAB_004939d7;
  case AND_V:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar11 = (psVar20->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar20[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((((MaxInt<unsigned_int> *)((long)&peVar11->ops + 4))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true)) {
      uVar10 = (ulong)(*(uint *)((long)&peVar4->ops + 8) + *(uint *)((long)&peVar11->ops + 8)) <<
               0x20;
      uVar16 = 1;
    }
    else {
      uVar10 = 0;
      uVar16 = 0;
    }
    __return_storage_ptr__->count = (peVar4->ops).count + (peVar11->ops).count;
    __return_storage_ptr__->sat = (MaxInt<unsigned_int>)(uVar10 | uVar16);
    break;
  case AND_B:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar11 = (psVar20->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar19 = psVar20[1].
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if ((((MaxInt<unsigned_int> *)((long)&peVar11->ops + 4))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar19->ops + 4))->valid == true)) {
      uVar10 = (ulong)(*(uint *)((long)&peVar19->ops + 8) + *(uint *)((long)&peVar11->ops + 8)) <<
               0x20;
      uVar16 = 1;
    }
    else {
      uVar10 = 0;
      uVar16 = 0;
    }
    MVar15 = (MaxInt<unsigned_int>)(uVar10 | uVar16);
    iVar21 = (peVar11->ops).count + (peVar19->ops).count;
    goto LAB_0049398c;
  case OR_B:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar11 = (psVar20->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar19 = psVar20[1].
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    uVar13 = 0;
    uVar17 = 0;
    bVar5 = false;
    if (((MaxInt<unsigned_int> *)((long)&peVar11->ops + 4))->valid == true) {
      uVar17 = 0;
      bVar5 = false;
      if (((MaxInt<unsigned_int> *)((long)&peVar19->ops + 0xc))->valid == true) {
        uVar17 = *(uint *)((long)&peVar19->ops + 0x10) + *(uint *)((long)&peVar11->ops + 8);
        bVar5 = true;
      }
    }
    bVar7 = false;
    if ((((MaxInt<unsigned_int> *)((long)&peVar19->ops + 4))->valid == true) &&
       (uVar13 = 0, ((MaxInt<unsigned_int> *)((long)&peVar11->ops + 0xc))->valid == true)) {
      uVar13 = *(uint *)((long)&peVar11->ops + 0x10) + *(uint *)((long)&peVar19->ops + 8);
      bVar7 = true;
    }
    bVar6 = bVar7;
    uVar14 = uVar13;
    if ((bVar5) && (bVar6 = bVar5, uVar14 = uVar17, bVar7 != false)) {
      if (uVar13 < uVar17) {
        uVar13 = uVar17;
      }
      bVar6 = true;
      uVar14 = uVar13;
    }
    iVar21 = (peVar11->ops).count + (peVar19->ops).count;
    MVar15 = (MaxInt<unsigned_int>)((ulong)uVar14 << 0x20 | (ulong)bVar6);
LAB_0049398c:
    uVar27 = iVar21 + 1;
    if (((MaxInt<unsigned_int> *)((long)&peVar11->ops + 0xc))->valid == true) {
LAB_004939af:
      if (((MaxInt<unsigned_int> *)((long)&peVar19->ops + 0xc))->valid != true) goto LAB_004939c6;
      uVar16 = (ulong)(*(uint *)((long)&peVar19->ops + 0x10) + *(uint *)((long)&peVar11->ops + 0x10)
                      ) << 0x20;
      uVar10 = 1;
    }
    else {
LAB_004939c6:
      uVar16 = 0;
      uVar10 = 0;
    }
    __return_storage_ptr__->count = uVar27;
    __return_storage_ptr__->sat = MVar15;
    __return_storage_ptr__->dsat = (MaxInt<unsigned_int>)(uVar16 | uVar10);
    goto LAB_004939d7;
  case OR_C:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar11 = (psVar20->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar20[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar10 = 0;
    bVar5 = false;
    if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true) {
      uVar10 = 0;
      bVar5 = false;
      if (((MaxInt<unsigned_int> *)((long)&peVar11->ops + 0xc))->valid == true) {
        uVar10 = (ulong)(*(uint *)((long)&peVar11->ops + 0x10) + *(uint *)((long)&peVar4->ops + 8));
        bVar5 = true;
      }
    }
    if (((MaxInt<unsigned_int> *)((long)&peVar11->ops + 4))->valid == false) {
      MVar18._1_7_ = 0;
      MVar18.valid = bVar5;
      MVar23 = MVar18;
    }
    else if (bVar5) {
      uVar13 = *(uint *)((long)&peVar11->ops + 8);
      if ((uint)uVar10 < uVar13) {
        uVar10 = (ulong)uVar13;
      }
      MVar23.valid = true;
      MVar23._1_3_ = 0;
      MVar23.value = 0;
      MVar18.valid = false;
      MVar18._1_3_ = 0;
      MVar18.value = 0;
    }
    else {
      MVar18 = *(MaxInt<unsigned_int> *)((long)&peVar11->ops + 4);
      uVar10 = (ulong)MVar18 >> 0x20;
      MVar23 = (MaxInt<unsigned_int>)((ulong)MVar18 & 0xff);
    }
    __return_storage_ptr__->count = (peVar11->ops).count + (peVar4->ops).count + 2;
    __return_storage_ptr__->sat =
         (MaxInt<unsigned_int>)((ulong)(MVar18._0_4_ & 0xffffff00) | uVar10 << 0x20 | (ulong)MVar23)
    ;
    break;
  case OR_D:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar11 = (psVar20->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar20[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar10 = 0;
    bVar5 = false;
    if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true) {
      uVar10 = 0;
      bVar5 = false;
      if (((MaxInt<unsigned_int> *)((long)&peVar11->ops + 0xc))->valid == true) {
        uVar10 = (ulong)(*(uint *)((long)&peVar11->ops + 0x10) + *(uint *)((long)&peVar4->ops + 8));
        bVar5 = true;
      }
    }
    if (((MaxInt<unsigned_int> *)((long)&peVar11->ops + 4))->valid == false) {
      MVar22._1_7_ = 0;
      MVar22.valid = bVar5;
      MVar24 = MVar22;
    }
    else if (bVar5) {
      uVar13 = *(uint *)((long)&peVar11->ops + 8);
      if ((uint)uVar10 < uVar13) {
        uVar10 = (ulong)uVar13;
      }
      MVar24.valid = true;
      MVar24._1_3_ = 0;
      MVar24.value = 0;
      MVar22.valid = false;
      MVar22._1_3_ = 0;
      MVar22.value = 0;
    }
    else {
      MVar22 = *(MaxInt<unsigned_int> *)((long)&peVar11->ops + 4);
      uVar10 = (ulong)MVar22 >> 0x20;
      MVar24 = (MaxInt<unsigned_int>)((ulong)MVar22 & 0xff);
    }
    MVar24 = (MaxInt<unsigned_int>)
             ((ulong)(MVar22._0_4_ & 0xffffff00) | uVar10 << 0x20 | (ulong)MVar24);
    if ((((MaxInt<unsigned_int> *)((long)&peVar11->ops + 0xc))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 0xc))->valid == true)) {
      uVar16 = (ulong)(*(uint *)((long)&peVar4->ops + 0x10) + *(uint *)((long)&peVar11->ops + 0x10))
               << 0x20;
      uVar10 = 1;
    }
    else {
      uVar16 = 0;
      uVar10 = 0;
    }
    MVar15 = (MaxInt<unsigned_int>)(uVar16 | uVar10);
    __return_storage_ptr__->count = (peVar11->ops).count + (peVar4->ops).count + 3;
    goto LAB_0049396c;
  case OR_I:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar11 = (psVar20->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar20[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((MaxInt<unsigned_int> *)((long)&peVar11->ops + 4))->valid == false) {
      MVar15 = *(MaxInt<unsigned_int> *)((long)&peVar4->ops + 4);
LAB_00493900:
      uVar10 = (ulong)MVar15 >> 0x20;
      MVar26 = MVar15;
    }
    else {
      if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == false) {
        MVar15 = *(MaxInt<unsigned_int> *)((long)&peVar11->ops + 4);
        goto LAB_00493900;
      }
      uVar13 = *(uint *)((long)&peVar11->ops + 8);
      uVar17 = *(uint *)((long)&peVar4->ops + 8);
      if (uVar17 < uVar13) {
        uVar17 = uVar13;
      }
      uVar10 = (ulong)uVar17;
      MVar26.valid = true;
      MVar26._1_3_ = 0;
      MVar26.value = 0;
      MVar15.valid = false;
      MVar15._1_3_ = 0;
      MVar15.value = 0;
    }
    MVar24 = (MaxInt<unsigned_int>)
             ((ulong)MVar26 & 0xff | (ulong)(MVar15._0_4_ & 0xffffff00) | uVar10 << 0x20);
    if (((MaxInt<unsigned_int> *)((long)&peVar11->ops + 0xc))->valid == false) {
      MVar12 = *(MaxInt<unsigned_int> *)((long)&peVar4->ops + 0xc);
LAB_0049394d:
      uVar10 = (ulong)MVar12 >> 0x20;
      MVar25 = MVar12;
    }
    else {
      if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 0xc))->valid == false) {
        MVar12 = *(MaxInt<unsigned_int> *)((long)&peVar11->ops + 0xc);
        goto LAB_0049394d;
      }
      uVar13 = *(uint *)((long)&peVar11->ops + 0x10);
      uVar17 = *(uint *)((long)&peVar4->ops + 0x10);
      if (uVar17 < uVar13) {
        uVar17 = uVar13;
      }
      uVar10 = (ulong)uVar17;
      MVar25.valid = true;
      MVar25._1_3_ = 0;
      MVar25.value = 0;
      MVar12.valid = false;
      MVar12._1_3_ = 0;
      MVar12.value = 0;
    }
    MVar15 = (MaxInt<unsigned_int>)
             ((ulong)MVar25 & 0xff | (ulong)(MVar12._0_4_ & 0xffffff00) | uVar10 << 0x20);
    __return_storage_ptr__->count = (peVar11->ops).count + (peVar4->ops).count + 3;
LAB_0049396c:
    __return_storage_ptr__->sat = MVar24;
LAB_00493970:
    __return_storage_ptr__->dsat = MVar15;
    goto LAB_004939d7;
  case ANDOR:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar11 = (psVar20->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar20[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar19 = psVar20[2].
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    uVar13 = 0;
    uVar17 = 0;
    bVar5 = false;
    if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true) {
      uVar17 = 0;
      bVar5 = false;
      if (((MaxInt<unsigned_int> *)((long)&peVar11->ops + 4))->valid == true) {
        uVar17 = *(uint *)((long)&peVar11->ops + 8) + *(uint *)((long)&peVar4->ops + 8);
        bVar5 = true;
      }
    }
    cVar1 = ((MaxInt<unsigned_int> *)((long)&peVar11->ops + 0xc))->valid;
    bVar7 = false;
    if ((cVar1 == '\x01') &&
       (uVar13 = 0, ((MaxInt<unsigned_int> *)((long)&peVar19->ops + 4))->valid == true)) {
      uVar13 = *(uint *)((long)&peVar19->ops + 8) + *(uint *)((long)&peVar11->ops + 0x10);
      bVar7 = true;
    }
    bVar6 = bVar7;
    uVar14 = uVar13;
    if ((bVar5) && (bVar6 = bVar5, uVar14 = uVar17, bVar7 != false)) {
      if (uVar13 < uVar17) {
        uVar13 = uVar17;
      }
      bVar6 = true;
      uVar14 = uVar13;
    }
    uVar27 = (peVar11->ops).count + (peVar4->ops).count + (peVar19->ops).count + 3;
    MVar15 = (MaxInt<unsigned_int>)((ulong)uVar14 << 0x20 | (ulong)bVar6);
    if (cVar1 != '\0') goto LAB_004939af;
    goto LAB_004939c6;
  case THRESH:
    local_78.valid = true;
    local_78 = (MaxInt<unsigned_int>)((ulong)local_78 & 0xffffffff);
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::reserve(&local_58,1);
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
    ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
              ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                *)&local_58,&local_78);
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar27 = 0;
    if (psVar20 != psVar3) {
      do {
        if (((local_58.
              super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->valid == '\x01') &&
           (peVar11 = (psVar20->
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr, (peVar11->ops).dsat.valid == true)) {
          uVar10 = (ulong)((peVar11->ops).dsat.value +
                          *(uint *)((long)local_58.
                                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 4)) << 0x20;
          uVar16 = 1;
        }
        else {
          uVar10 = 0;
          uVar16 = 0;
        }
        local_80 = (MaxInt<unsigned_int>)(uVar10 | uVar16);
        uVar2 = (((psVar20->
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->ops).count;
        local_78.valid = false;
        local_78._1_3_ = 0;
        local_78.value = 0;
        pMStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ::reserve((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   *)&local_78,1);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&local_78,&local_80);
        uVar10 = (long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (8 < uVar10) {
          uVar16 = 1;
          do {
            peVar11 = (psVar20->
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
            uVar13 = 0;
            uVar17 = 0;
            bVar5 = false;
            if (((MaxInt<unsigned_int> *)
                ((long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar16 * 8))->valid == true) {
              uVar17 = 0;
              bVar5 = false;
              if ((peVar11->ops).dsat.valid == true) {
                uVar17 = (peVar11->ops).dsat.value +
                         ((uint *)((long)local_58.
                                         super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4))[uVar16 * 2]
                ;
                bVar5 = true;
              }
            }
            bVar7 = false;
            if ((((MaxInt<unsigned_int> *)
                 ((long)local_58.
                        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + -8))[uVar16].valid == true) &&
               (uVar13 = 0, (peVar11->ops).sat.valid == true)) {
              uVar13 = (peVar11->ops).sat.value +
                       ((uint *)((long)local_58.
                                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + -4))[uVar16 * 2];
              bVar7 = true;
            }
            bVar6 = bVar7;
            uVar14 = uVar13;
            if ((bVar5) && (bVar6 = bVar5, uVar14 = uVar17, bVar7 != false)) {
              if (uVar13 < uVar17) {
                uVar13 = uVar17;
              }
              bVar6 = true;
              uVar14 = uVar13;
            }
            local_80 = (MaxInt<unsigned_int>)((ulong)uVar14 << 0x20 | (ulong)bVar6);
            std::
            vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
            ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                      ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                        *)&local_78,&local_80);
            uVar16 = uVar16 + 1;
            uVar10 = (long)local_58.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar16 < (ulong)((long)uVar10 >> 3));
        }
        if (((&((MaxInt<unsigned_int> *)
               ((long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + -8))->valid)[uVar10] == true) &&
           (peVar11 = (psVar20->
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr, (peVar11->ops).sat.valid == true)) {
          uVar16 = (ulong)((peVar11->ops).sat.value +
                          *(int *)((long)((long)local_58.
                                                super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + -4) +
                                  uVar10)) << 0x20;
          uVar10 = 1;
        }
        else {
          uVar16 = 0;
          uVar10 = 0;
        }
        local_80 = (MaxInt<unsigned_int>)(uVar16 | uVar10);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&local_78,&local_80);
        pMVar9 = local_58.
                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar8 = local_58.
                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pMStack_70;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
        local_78.valid = false;
        local_78._1_3_ = 0;
        local_78.value = 0;
        pMStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        if ((MaxInt<unsigned_int>)pMVar8 != (MaxInt<unsigned_int>)0x0) {
          operator_delete(pMVar8,(long)pMVar9 - (long)pMVar8);
        }
        if (local_78 != (MaxInt<unsigned_int>)0x0) {
          operator_delete((void *)local_78,(long)local_68 - (long)local_78);
        }
        uVar27 = uVar27 + uVar2 + 1;
        psVar20 = psVar20 + 1;
      } while (psVar20 != psVar3);
    }
    if ((ulong)((long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)this->k) {
      __assert_fail("k <= sats.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0x3db,
                    "internal::Ops miniscript::Node<CPubKey>::CalcOps() const [Key = CPubKey]");
    }
    MVar15 = *(MaxInt<unsigned_int> *)
              ((long)local_58.
                     super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (ulong)this->k * 8);
    MVar26 = *local_58.
              super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __return_storage_ptr__->count = uVar27;
    __return_storage_ptr__->sat = MVar15;
    __return_storage_ptr__->dsat = MVar26;
    operator_delete(local_58.
                    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    goto LAB_004939d7;
  case MULTI:
    MVar15 = (MaxInt<unsigned_int>)
             ((ulong)(uint)(*(int *)&(this->keys).
                                     super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                           *(int *)&(this->keys).
                                    super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                                    super__Vector_impl_data._M_start) * -0x3f03f03f00000000 + 1);
    __return_storage_ptr__->count = 1;
    __return_storage_ptr__->sat = MVar15;
    goto LAB_00493970;
  case MULTI_A:
    __return_storage_ptr__->count =
         (*(int *)&(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                   super__Vector_impl_data._M_finish -
         *(int *)&(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                  super__Vector_impl_data._M_start) * -0x3f03f03f + 1;
LAB_00493839:
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).value = 0;
    (__return_storage_ptr__->dsat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).value = 0;
    goto LAB_004939d7;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                  ,0x3df,"internal::Ops miniscript::Node<CPubKey>::CalcOps() const [Key = CPubKey]")
    ;
  }
  (__return_storage_ptr__->dsat).valid = false;
  *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
  (__return_storage_ptr__->dsat).value = 0;
LAB_004939d7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

internal::Ops CalcOps() const {
        switch (fragment) {
            case Fragment::JUST_1: return {0, 0, {}};
            case Fragment::JUST_0: return {0, {}, 0};
            case Fragment::PK_K: return {0, 0, 0};
            case Fragment::PK_H: return {3, 0, 0};
            case Fragment::OLDER:
            case Fragment::AFTER: return {1, 0, {}};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {4, 0, {}};
            case Fragment::AND_V: return {subs[0]->ops.count + subs[1]->ops.count, subs[0]->ops.sat + subs[1]->ops.sat, {}};
            case Fragment::AND_B: {
                const auto count{1 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat + subs[1]->ops.sat};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_B: {
                const auto count{1 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{(subs[0]->ops.sat + subs[1]->ops.dsat) | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_D: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_C: {
                const auto count{2 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                return {count, sat, {}};
            }
            case Fragment::OR_I: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | subs[1]->ops.sat};
                const auto dsat{subs[0]->ops.dsat | subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::ANDOR: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count + subs[2]->ops.count};
                const auto sat{(subs[1]->ops.sat + subs[0]->ops.sat) | (subs[0]->ops.dsat + subs[2]->ops.sat)};
                const auto dsat{subs[0]->ops.dsat + subs[2]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::MULTI: return {1, (uint32_t)keys.size(), (uint32_t)keys.size()};
            case Fragment::MULTI_A: return {(uint32_t)keys.size() + 1, 0, 0};
            case Fragment::WRAP_S:
            case Fragment::WRAP_C:
            case Fragment::WRAP_N: return {1 + subs[0]->ops.count, subs[0]->ops.sat, subs[0]->ops.dsat};
            case Fragment::WRAP_A: return {2 + subs[0]->ops.count, subs[0]->ops.sat, subs[0]->ops.dsat};
            case Fragment::WRAP_D: return {3 + subs[0]->ops.count, subs[0]->ops.sat, 0};
            case Fragment::WRAP_J: return {4 + subs[0]->ops.count, subs[0]->ops.sat, 0};
            case Fragment::WRAP_V: return {subs[0]->ops.count + (subs[0]->GetType() << "x"_mst), subs[0]->ops.sat, {}};
            case Fragment::THRESH: {
                uint32_t count = 0;
                auto sats = Vector(internal::MaxInt<uint32_t>(0));
                for (const auto& sub : subs) {
                    count += sub->ops.count + 1;
                    auto next_sats = Vector(sats[0] + sub->ops.dsat);
                    for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back((sats[j] + sub->ops.dsat) | (sats[j - 1] + sub->ops.sat));
                    next_sats.push_back(sats[sats.size() - 1] + sub->ops.sat);
                    sats = std::move(next_sats);
                }
                assert(k <= sats.size());
                return {count, sats[k], sats[0]};
            }
        }
        assert(false);
    }